

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Poisson::prepareNextState(Poisson *this)

{
  bool bVar1;
  double dVar2;
  
  if ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextStateIsPrepared == false) {
    dVar2 = RandN::dRandE((RandN *)this);
    bVar1 = dVar2 < this->poissonRate;
    if (bVar1) {
      (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextValue =
           (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
           stochNextValue + 1.0;
    }
    (this->super_StochasticEventGenerator).eventNextValue = bVar1;
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void Poisson::prepareNextState()
{
	if (!stochNextStateIsPrepared) {
		if( dRandE() < poissonRate ) {
			stochNextValue += 1.0;
            eventNextValue = true;
        }
        else
            eventNextValue = false;
		stochNextStateIsPrepared = true;
	}
}